

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

int cmOutputConverter::Shell__CharNeedsQuotes(char c,int flags)

{
  int iVar1;
  int flags_local;
  char c_local;
  
  if (((flags & 0x100U) == 0) && ((flags & 4U) != 0)) {
    flags_local = 0;
  }
  else {
    iVar1 = Shell__CharIsWhitespace(c);
    if (iVar1 == 0) {
      if ((flags & 0x100U) == 0) {
        iVar1 = Shell__CharNeedsQuotesOnWindows(c);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        iVar1 = Shell__CharNeedsQuotesOnUnix(c);
        if (iVar1 != 0) {
          return 1;
        }
      }
      flags_local = 0;
    }
    else {
      flags_local = 1;
    }
  }
  return flags_local;
}

Assistant:

int cmOutputConverter::Shell__CharNeedsQuotes(char c, int flags)
{
  /* On Windows the built-in command shell echo never needs quotes.  */
  if (!(flags & Shell_Flag_IsUnix) && (flags & Shell_Flag_EchoWindows)) {
    return 0;
  }

  /* On all platforms quotes are needed to preserve whitespace.  */
  if (Shell__CharIsWhitespace(c)) {
    return 1;
  }

  if (flags & Shell_Flag_IsUnix) {
    /* On UNIX several special characters need quotes to preserve them.  */
    if (Shell__CharNeedsQuotesOnUnix(c)) {
      return 1;
    }
  } else {
    /* On Windows several special characters need quotes to preserve them.  */
    if (Shell__CharNeedsQuotesOnWindows(c)) {
      return 1;
    }
  }
  return 0;
}